

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::weibull_dist<double>::pdf(weibull_dist<double> *this,result_type_conflict2 x)

{
  double __y;
  result_type_conflict2 rVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double __x;
  
  rVar1 = 0.0;
  if (0.0 <= x) {
    dVar2 = (this->P).theta_;
    __y = (this->P).beta_;
    __x = x / dVar2;
    rVar1 = 0.0;
    if (__x <= 0.0) {
      if ((__y != 1.0) || (NAN(__y))) {
        if (__y <= 1.0) {
          rVar1 = NAN;
        }
      }
      else {
        rVar1 = 1.0 / dVar2;
      }
    }
    else {
      dVar2 = pow(__x,__y);
      auVar3._8_8_ = (this->P).beta_;
      auVar3._0_8_ = dVar2;
      auVar4._8_8_ = (this->P).theta_;
      auVar4._0_8_ = __x;
      auVar4 = divpd(auVar3,auVar4);
      dVar2 = exp(-dVar2);
      rVar1 = dVar2 * auVar4._8_8_ * auVar4._0_8_;
    }
  }
  return rVar1;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= P.theta();
      if (x > 0) {
        const result_type t1{math::pow(x, P.beta())};
        const result_type t2{t1 / x};
        return P.beta() / P.theta() * t2 * math::exp(-t1);
      }
      // x==0
      if (P.beta() == 1)
        return 1 / P.theta();
      if (P.beta() > 1)
        return 0;
      return math::numeric_limits<result_type>::quiet_NaN();
    }